

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O2

void __thiscall embree::LineCommentFilter::~LineCommentFilter(LineCommentFilter *this)

{
  Stream<int> *pSVar1;
  
  (this->super_Stream<int>).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__LineCommentFilter_002a8580;
  std::__cxx11::string::~string((string *)&this->lineComment);
  pSVar1 = (this->cin).ptr;
  if (pSVar1 != (Stream<int> *)0x0) {
    (*(pSVar1->super_RefCount)._vptr_RefCount[3])();
  }
  Stream<int>::~Stream(&this->super_Stream<int>);
  return;
}

Assistant:

LineCommentFilter (const FileName& fileName, const std::string& lineComment)
      : cin(new FileStream(fileName)), lineComment(lineComment) {}